

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

void spvc_convert_msl_sampler(MSLConstexprSampler *samp,spvc_msl_constexpr_sampler *sampler)

{
  float fVar1;
  spvc_msl_sampler_address sVar2;
  spvc_msl_sampler_address sVar3;
  spvc_msl_sampler_compare_func sVar4;
  spvc_msl_sampler_filter sVar5;
  spvc_msl_sampler_filter sVar6;
  spvc_msl_sampler_mip_filter sVar7;
  
  fVar1 = sampler->lod_clamp_max;
  samp->lod_clamp_min = sampler->lod_clamp_min;
  samp->lod_clamp_max = fVar1;
  samp->lod_clamp_enable = sampler->lod_clamp_enable != '\0';
  samp->compare_enable = sampler->compare_enable != '\0';
  samp->anisotropy_enable = sampler->anisotropy_enable != '\0';
  samp->max_anisotropy = sampler->max_anisotropy;
  sVar2 = sampler->t_address;
  sVar3 = sampler->r_address;
  sVar4 = sampler->compare_func;
  samp->s_address = sampler->s_address;
  samp->t_address = sVar2;
  samp->r_address = sVar3;
  samp->compare_func = sVar4;
  sVar5 = sampler->min_filter;
  sVar6 = sampler->mag_filter;
  sVar7 = sampler->mip_filter;
  samp->coord = sampler->coord;
  samp->min_filter = sVar5;
  samp->mag_filter = sVar6;
  samp->mip_filter = sVar7;
  samp->border_color = sampler->border_color;
  return;
}

Assistant:

static void spvc_convert_msl_sampler(MSLConstexprSampler &samp, const spvc_msl_constexpr_sampler *sampler)
{
	samp.s_address = static_cast<MSLSamplerAddress>(sampler->s_address);
	samp.t_address = static_cast<MSLSamplerAddress>(sampler->t_address);
	samp.r_address = static_cast<MSLSamplerAddress>(sampler->r_address);
	samp.lod_clamp_min = sampler->lod_clamp_min;
	samp.lod_clamp_max = sampler->lod_clamp_max;
	samp.lod_clamp_enable = sampler->lod_clamp_enable != 0;
	samp.min_filter = static_cast<MSLSamplerFilter>(sampler->min_filter);
	samp.mag_filter = static_cast<MSLSamplerFilter>(sampler->mag_filter);
	samp.mip_filter = static_cast<MSLSamplerMipFilter>(sampler->mip_filter);
	samp.compare_enable = sampler->compare_enable != 0;
	samp.anisotropy_enable = sampler->anisotropy_enable != 0;
	samp.max_anisotropy = sampler->max_anisotropy;
	samp.compare_func = static_cast<MSLSamplerCompareFunc>(sampler->compare_func);
	samp.coord = static_cast<MSLSamplerCoord>(sampler->coord);
	samp.border_color = static_cast<MSLSamplerBorderColor>(sampler->border_color);
}